

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O3

int strtoi_lim(char *str,char **ep,int llim,int ulim)

{
  char *pcVar1;
  int iVar2;
  int rulim;
  char *sp;
  char *pcVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  
  iVar2 = 0;
  pcVar3 = str;
  if ((0 < ulim) && (bVar6 = *str - 0x30, iVar2 = 0, bVar6 < 10)) {
    iVar4 = 0;
    pcVar1 = str + 1;
    iVar5 = ulim;
    do {
      pcVar3 = pcVar1;
      iVar2 = (uint)bVar6 + iVar4;
      iVar4 = iVar2 * 10;
      if ((ulim < iVar4) || (0xffffffec < iVar5 - 10U)) break;
      iVar5 = iVar5 / 10;
      bVar6 = *pcVar3 - 0x30;
      pcVar1 = pcVar3 + 1;
    } while (bVar6 < 10);
  }
  iVar5 = iVar2;
  if (ulim < iVar2) {
    iVar5 = -2;
  }
  if (iVar2 < llim) {
    iVar5 = -2;
  }
  iVar2 = -1;
  if (pcVar3 != str) {
    iVar2 = iVar5;
  }
  *ep = pcVar3;
  return iVar2;
}

Assistant:

static int
strtoi_lim(const char *str, const char **ep, int llim, int ulim)
{
	int res = 0;
	const char *sp;
	/* we keep track of the number of digits via rulim */
	int rulim;

	for (sp = str, rulim = ulim > 10 ? ulim : 10;
	     res * 10 <= ulim && rulim && *sp >= '0' && *sp <= '9';
	     sp++, rulim /= 10) {
		res *= 10;
		res += *sp - '0';
	}
	if (sp == str) {
		res = -1;
	} else if (res < llim || res > ulim) {
		res = -2;
	}
	*ep = (const char*)sp;
	return res;
}